

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t exr_decoding_destroy(exr_const_context_t ctxt,exr_decode_pipeline_t *decode)

{
  void *in_RSI;
  long in_RDI;
  exr_decode_pipeline_t nil;
  undefined1 local_210 [16];
  size_t *in_stack_fffffffffffffe00;
  void **in_stack_fffffffffffffe08;
  exr_transcoding_pipeline_buffer_id_t in_stack_fffffffffffffe14;
  exr_decode_pipeline_t *in_stack_fffffffffffffe18;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RSI != (void *)0x0) {
      memset(local_210,0,0x1f8);
      if (*(long *)((long)in_RSI + 8) != (long)in_RSI + 0x108) {
        (**(code **)(in_RDI + 0x60))(*(undefined8 *)((long)in_RSI + 8));
      }
      if ((*(long *)((long)in_RSI + 0x88) == *(long *)((long)in_RSI + 0x78)) &&
         (*(long *)((long)in_RSI + 0x90) == 0)) {
        *(undefined8 *)((long)in_RSI + 0x88) = 0;
      }
      if ((*(long *)((long)in_RSI + 0xa8) == *(long *)((long)in_RSI + 0x98)) &&
         (*(long *)((long)in_RSI + 0xb0) == 0)) {
        *(undefined8 *)((long)in_RSI + 0xa8) = 0;
      }
      internal_decode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      internal_decode_free_buffer
                (in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,
                 in_stack_fffffffffffffe00);
      memcpy(in_RSI,local_210,0x1f8);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_decoding_destroy (exr_const_context_t ctxt, exr_decode_pipeline_t* decode)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (decode)
    {
        exr_decode_pipeline_t nil = {0};
        if (decode->channels != decode->_quick_chan_store)
            ctxt->free_fn (decode->channels);

        if (decode->unpacked_buffer == decode->packed_buffer &&
            decode->unpacked_alloc_size == 0)
            decode->unpacked_buffer = NULL;

        if (decode->sample_count_table == decode->packed_sample_count_table &&
            decode->sample_count_alloc_size == 0)
            decode->sample_count_table = NULL;

        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED,
            &(decode->packed_buffer),
            &(decode->packed_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_UNPACKED,
            &(decode->unpacked_buffer),
            &(decode->unpacked_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(decode->scratch_buffer_1),
            &(decode->scratch_alloc_size_1));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SCRATCH2,
            &(decode->scratch_buffer_2),
            &(decode->scratch_alloc_size_2));

        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_SAMPLES,
            (void**) &(decode->sample_count_table),
            &(decode->sample_count_alloc_size));
        internal_decode_free_buffer (
            decode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(decode->packed_sample_count_table),
            &(decode->packed_sample_count_alloc_size));
        *decode = nil;
    }
    return EXR_ERR_SUCCESS;
}